

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  CompilerError *pCVar5;
  ulong uVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  Decoration *pDVar9;
  TypedID *this_00;
  uint *puVar10;
  uint32_t base_alignment;
  uint32_t alignment;
  uint32_t packed_alignment;
  SPIRType *member_type;
  Bitset member_flags;
  uint32_t i;
  uint32_t pad_alignment;
  uint32_t size;
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  uint32_t local_30;
  BufferPackingStandard local_2c;
  uint32_t packed_size;
  BufferPackingStandard packing_local;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  local_2c = packing;
  _packed_size = flags;
  flags_local = (Bitset *)type;
  type_local = (SPIRType *)this;
  bVar2 = VectorView<unsigned_int>::empty(&(type->array).super_VectorView<unsigned_int>);
  if (bVar2) {
    if ((int)flags_local[2].lower == 0x14e5) {
      if (((ulong)flags_local[1].higher._M_h._M_single_bucket & 0x100000000) == 0) {
        local_65 = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_50,"Types in PhysicalStorageBufferEXT must be pointers.",&local_51);
        CompilerError::CompilerError(pCVar5,(string *)local_50);
        local_65 = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
        pad_alignment._2_1_ = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&size,
                   "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                   ,(allocator *)((long)&pad_alignment + 3));
        CompilerError::CompilerError(pCVar5,(string *)&size);
        pad_alignment._2_1_ = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      this_local._4_4_ = 8;
    }
    else {
      i = 0;
      if (*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) == 0xf) {
        member_flags.higher._M_h._M_single_bucket._4_4_ = 1;
        for (member_flags.higher._M_h._M_single_bucket._0_4_ = 0;
            uVar6 = (ulong)(uint)member_flags.higher._M_h._M_single_bucket,
            sVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               &flags_local[2].higher), uVar6 < sVar7;
            member_flags.higher._M_h._M_single_bucket._0_4_ =
                 (uint)member_flags.higher._M_h._M_single_bucket + 1) {
          pmVar8 = ::std::
                   unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_Compiler).ir.meta,(key_type *)&flags_local->higher);
          pDVar9 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                             (&(pmVar8->members).super_VectorView<spirv_cross::Meta::Decoration>,
                              (ulong)(uint)member_flags.higher._M_h._M_single_bucket);
          Bitset::Bitset((Bitset *)&member_type,&pDVar9->decoration_flags);
          this_00 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                               &flags_local[2].higher,
                               (ulong)(uint)member_flags.higher._M_h._M_single_bucket);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          _alignment = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
          base_alignment = type_to_packed_alignment(this,_alignment,(Bitset *)&member_type,local_2c)
          ;
          puVar10 = ::std::max<unsigned_int>
                              (&base_alignment,
                               (uint *)((long)&member_flags.higher._M_h._M_single_bucket + 4));
          uVar1 = *puVar10;
          if (*(int *)&(_alignment->super_IVariant).field_0xc == 0xf) {
            member_flags.higher._M_h._M_single_bucket._4_4_ = base_alignment;
          }
          else {
            member_flags.higher._M_h._M_single_bucket._4_4_ = 1;
          }
          uVar3 = type_to_packed_size(this,_alignment,(Bitset *)&member_type,local_2c);
          i = uVar3 + ((i - 1) + uVar1 & -uVar1);
          Bitset::~Bitset((Bitset *)&member_type);
        }
      }
      else {
        uVar3 = type_to_packed_base_size(this,(SPIRType *)flags_local,local_2c);
        bVar2 = packing_is_scalar(local_2c);
        if (bVar2) {
          i = *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) *
              *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * uVar3;
        }
        else {
          if (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 1) {
            i = *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) * uVar3;
          }
          bVar2 = Bitset::get(_packed_size,5);
          if ((bVar2) && (1 < *(uint *)&(flags_local->higher)._M_h._M_before_begin._M_nxt)) {
            bVar2 = packing_is_vec4_padded(local_2c);
            if (bVar2) {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * 4;
            }
            else if (*(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) == 3) {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * 4;
            }
            else {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt *
                      *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4);
            }
            i = iVar4 * uVar3;
          }
          bVar2 = Bitset::get(_packed_size,4);
          if ((bVar2) && (1 < *(uint *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4))) {
            bVar2 = packing_is_vec4_padded(local_2c);
            if (bVar2) {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) * 4;
            }
            else if (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 3) {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) * 4;
            }
            else {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) *
                      *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt;
            }
            i = iVar4 * uVar3;
          }
          bVar2 = packing_is_hlsl(local_2c);
          if ((bVar2) && (1 < *(uint *)&(flags_local->higher)._M_h._M_before_begin._M_nxt)) {
            i = i - (4 - *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4)) *
                    ((uint)(flags_local->higher)._M_h._M_bucket_count >> 3);
          }
        }
      }
      this_local._4_4_ = i;
    }
  }
  else {
    uVar3 = to_array_size_literal(this,(SPIRType *)flags_local);
    local_30 = type_to_packed_array_stride(this,(SPIRType *)flags_local,_packed_size,local_2c);
    local_30 = uVar3 * local_30;
    bVar2 = packing_is_hlsl(local_2c);
    if ((bVar2) && (*(int *)((long)&(flags_local->higher)._M_h._M_buckets + 4) != 0xf)) {
      local_30 = local_30 -
                 (4 - *(int *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4)) *
                 ((uint)(flags_local->higher)._M_h._M_bucket_count >> 3);
    }
    this_local._4_4_ = local_30;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	if (!type.array.empty())
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (type.storage == StorageClassPhysicalStorageBufferEXT)
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}